

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O0

bool __thiscall
QDnsLookupRunnable::sendDnsOverTls
          (QDnsLookupRunnable *this,QDnsLookupReply *reply,
          QSpan<unsigned_char,_18446744073709551615UL> query,ReplyBuffer *response)

{
  QLatin1StringView latin1;
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  QSslConfiguration *__u;
  long in_RSI;
  QDnsLookupReply *in_RDI;
  QVLABase<unsigned_char> *in_R8;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  anon_class_16_2_16dbff69 waitForBytes;
  QDeadlineTimer timeout;
  quint16 size;
  QSslSocket socket;
  undefined4 in_stack_fffffffffffffef8;
  OpenModeFlag in_stack_fffffffffffffefc;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined2 in_stack_ffffffffffffff06;
  undefined2 uVar5;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_ffffffffffffff08;
  anon_class_16_2_16dbff69 *this_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  QSslSocket *this_01;
  bool local_a9;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> in_stack_ffffffffffffff8c;
  unsigned_short local_52 [21];
  char local_28 [16];
  QSpan<unsigned_char,_18446744073709551615UL> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0] = -0x56;
  local_28[1] = -0x56;
  local_28[2] = -0x56;
  local_28[3] = -0x56;
  local_28[4] = -0x56;
  local_28[5] = -0x56;
  local_28[6] = -0x56;
  local_28[7] = -0x56;
  local_28[8] = -0x56;
  local_28[9] = -0x56;
  local_28[10] = -0x56;
  local_28[0xb] = -0x56;
  local_28[0xc] = -0x56;
  local_28[0xd] = -0x56;
  local_28[0xe] = -0x56;
  local_28[0xf] = -0x56;
  QSslSocket::QSslSocket((QSslSocket *)in_RDI,(QObject *)in_stack_ffffffffffffff08.__r);
  this_00 = (anon_class_16_2_16dbff69 *)&(in_RDI->hostAddressRecords).d.size;
  QSslConfiguration::defaultConfiguration();
  std::optional<QSslConfiguration>::value_or<QSslConfiguration>
            ((optional<QSslConfiguration> *)this_00,(QSslConfiguration *)in_RDI);
  QSslSocket::setSslConfiguration
            ((QSslSocket *)
             CONCAT26(in_stack_ffffffffffffff06,
                      CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00)),
             (QSslConfiguration *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x34165b);
  QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x341668);
  QVar4 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_ffffffffffffff08.__r,
                     CONCAT26(in_stack_ffffffffffffff06,
                              CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00)));
  this_01 = (QSslSocket *)QVar4.m_size;
  latin1.m_data = (char *)in_R8;
  latin1.m_size = (qsizetype)QVar4.m_data;
  QString::QString((QString *)in_RDI,latin1);
  QAbstractSocket::setProtocolTag
            ((QAbstractSocket *)
             CONCAT26(in_stack_ffffffffffffff06,
                      CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00)),
             (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QString::~QString((QString *)0x3416bc);
  pbVar3 = QSpan<unsigned_char,_18446744073709551615UL>::operator[]
                     ((QSpan<unsigned_char,_18446744073709551615UL> *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0x3416ce);
  *pbVar3 = *pbVar3 | 0x20;
  QSpan<unsigned_char,_18446744073709551615UL>::size(&local_18);
  local_52[0] = qToBigEndian<unsigned_short>(0);
  QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000l>>
            ((QDeadlineTimer *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_ffffffffffffff08,PreciseTimer);
  QHostAddress::toString((QHostAddress *)this_00);
  uVar5 = *(undefined2 *)((long)&(in_RDI->hostAddressRecords).d.ptr + 4);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT26(uVar5,CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00)),
             in_stack_fffffffffffffefc);
  QSslSocket::connectToHostEncrypted
            ((QSslSocket *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (QString *)this_00,(quint16)((ulong)in_RDI >> 0x30),
             (OpenMode)in_stack_ffffffffffffff8c.i,(NetworkLayerProtocol)in_RDI);
  QString::~QString((QString *)0x3417a1);
  QIODevice::write(local_28,(longlong)local_52);
  __u = (QSslConfiguration *)QSpan<unsigned_char,_18446744073709551615UL>::data(&local_18);
  QSpan<unsigned_char,_18446744073709551615UL>::size(&local_18);
  QIODevice::write(local_28,(longlong)__u);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&DnsOverTlsConnectTimeout);
  bVar1 = QSslSocket::waitForEncrypted
                    ((QSslSocket *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (int)((ulong)this_00 >> 0x20));
  if (bVar1) {
    QSslSocket::sslConfiguration(this_01);
    std::optional<QSslConfiguration>::operator=((optional<QSslConfiguration> *)in_RDI,__u);
    iVar2 = (int)((ulong)__u >> 0x20);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x341845);
    bVar1 = sendDnsOverTls::anon_class_16_2_16dbff69::operator()(this_00,in_RDI,iVar2);
    if (bVar1) {
      local_52[0] = qFromBigEndian<unsigned_short>(0);
      QVarLengthArray<unsigned_char,_1232LL>::resize
                ((QVarLengthArray<unsigned_char,_1232LL> *)
                 CONCAT26(uVar5,CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00)),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QVLABase<unsigned_char>::data(in_R8);
      bVar1 = sendDnsOverTls::anon_class_16_2_16dbff69::operator()(this_00,in_RDI,iVar2);
      if (bVar1) {
        if (3 < local_52[0]) {
          pbVar3 = QVLABase<unsigned_char>::operator[]
                             ((QVLABase<unsigned_char> *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0x341901
                             );
          *(bool *)(in_RSI + 4) = (*pbVar3 & 0x20) != 0;
        }
        local_a9 = true;
        goto LAB_00341951;
      }
    }
  }
  iVar2 = makeReplyErrorFromSocket(in_RDI,(QAbstractSocket *)in_R8);
  local_a9 = iVar2 != 0;
LAB_00341951:
  QSslSocket::~QSslSocket((QSslSocket *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a9;
}

Assistant:

bool QDnsLookupRunnable::sendDnsOverTls(QDnsLookupReply *reply, QSpan<unsigned char> query,
                                        ReplyBuffer &response)
{
    QSslSocket socket;
    socket.setSslConfiguration(sslConfiguration.value_or(QSslConfiguration::defaultConfiguration()));

#  if QT_CONFIG(networkproxy)
    socket.setProtocolTag("domain-s"_L1);
#  endif

    // Request the name server attempt to authenticate the reply.
    query[3] |= DnsAuthenticDataBit;

    do {
        quint16 size = qToBigEndian<quint16>(query.size());
        QDeadlineTimer timeout(DnsOverTlsTimeout);

        socket.connectToHostEncrypted(nameserver.toString(), port);
        socket.write(reinterpret_cast<const char *>(&size), sizeof(size));
        socket.write(reinterpret_cast<const char *>(query.data()), query.size());
        if (!socket.waitForEncrypted(DnsOverTlsConnectTimeout.count()))
            break;

        reply->sslConfiguration = socket.sslConfiguration();

        // accumulate reply
        auto waitForBytes = [&](void *buffer, int count) {
            int remaining = timeout.remainingTime();
            while (remaining >= 0 && socket.bytesAvailable() < count) {
                if (!socket.waitForReadyRead(remaining))
                    return false;
            }
            return socket.read(static_cast<char *>(buffer), count) == count;
        };
        if (!waitForBytes(&size, sizeof(size)))
            break;

        // note: strictly speaking, we're allocating memory based on untrusted data
        // but in practice, due to limited range of the data type (16 bits),
        // the maximum allocation is small.
        size = qFromBigEndian(size);
        response.resize(size);
        if (waitForBytes(response.data(), size)) {
            // check if the AD bit is set; we'll trust it over TLS requests
            if (size >= 4)
                reply->authenticData = response[3] & DnsAuthenticDataBit;
            return true;
        }
    } while (false);

    // handle errors
    return makeReplyErrorFromSocket(reply, &socket);
}